

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_iterator_suite.cpp
# Opt level: O1

void reverse_iterator_suite::run(void)

{
  iterate_null();
  iterate_boolean();
  iterate_integer();
  iterate_real();
  iterate_string();
  iterate_wstring();
  iterate_u16string();
  iterate_u32string();
  iterate_array();
  iterate_map();
  return;
}

Assistant:

void run()
{
    iterate_null();
    iterate_boolean();
    iterate_integer();
    iterate_real();
    iterate_string();
    iterate_wstring();
    iterate_u16string();
    iterate_u32string();
    iterate_array();
    iterate_map();
}